

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

void read_vec_element_i32
               (TCGContext_conflict12 *tcg_ctx,TCGv_i32 dst,uint8_t reg,uint8_t enr,
               MemOp_conflict memop)

{
  int iVar1;
  int offs;
  MemOp_conflict memop_local;
  uint8_t enr_local;
  uint8_t reg_local;
  TCGv_i32 dst_local;
  TCGContext_conflict12 *tcg_ctx_local;
  
  iVar1 = vec_reg_offset(reg,enr,memop & MO_64);
  switch(memop) {
  case MO_8:
    tcg_gen_ld8u_i32(tcg_ctx,dst,tcg_ctx->cpu_env,(long)iVar1);
    break;
  case MO_16:
    tcg_gen_ld16u_i32(tcg_ctx,dst,tcg_ctx->cpu_env,(long)iVar1);
    break;
  case MO_32:
  case MO_LESL:
    tcg_gen_ld_i32(tcg_ctx,dst,tcg_ctx->cpu_env,(long)iVar1);
    break;
  default:
    break;
  case MO_ASHIFT:
    tcg_gen_ld8s_i32(tcg_ctx,dst,tcg_ctx->cpu_env,(long)iVar1);
    break;
  case MO_LESW:
    tcg_gen_ld16s_i32(tcg_ctx,dst,tcg_ctx->cpu_env,(long)iVar1);
  }
  return;
}

Assistant:

static void read_vec_element_i32(DisasContext *s, TCGv_i32 tcg_dest, int srcidx,
                                 int element, MemOp memop)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int vect_off = vec_reg_offset(s, srcidx, element, memop & MO_SIZE);
    switch (memop) {
    case MO_8:
        tcg_gen_ld8u_i32(tcg_ctx, tcg_dest, tcg_ctx->cpu_env, vect_off);
        break;
    case MO_16:
        tcg_gen_ld16u_i32(tcg_ctx, tcg_dest, tcg_ctx->cpu_env, vect_off);
        break;
    case MO_8|MO_SIGN:
        tcg_gen_ld8s_i32(tcg_ctx, tcg_dest, tcg_ctx->cpu_env, vect_off);
        break;
    case MO_16|MO_SIGN:
        tcg_gen_ld16s_i32(tcg_ctx, tcg_dest, tcg_ctx->cpu_env, vect_off);
        break;
    case MO_32:
    case MO_32|MO_SIGN:
        tcg_gen_ld_i32(tcg_ctx, tcg_dest, tcg_ctx->cpu_env, vect_off);
        break;
    default:
        g_assert_not_reached();
    }
}